

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

size_t atohex(uchar *b,size_t bsize,char *p,size_t psize)

{
  byte bVar1;
  char cVar2;
  byte local_39;
  uchar x;
  size_t fbsize;
  size_t psize_local;
  char *p_local;
  size_t bsize_local;
  uchar *b_local;
  
  fbsize = psize;
  psize_local = (size_t)p;
  p_local = (char *)bsize;
  bsize_local = (size_t)b;
  do {
    if (p_local == (char *)0x0 || fbsize < 2) {
      return bsize - (long)p_local;
    }
    if ((*(char *)psize_local < 'a') || ('z' < *(char *)psize_local)) {
      if ((*(char *)psize_local < 'A') || ('Z' < *(char *)psize_local)) {
        if ((*(char *)psize_local < '0') || ('9' < *(char *)psize_local)) {
          return 0xffffffffffffffff;
        }
        cVar2 = *(char *)psize_local;
      }
      else {
        cVar2 = *(char *)psize_local + -0x37;
      }
    }
    else {
      cVar2 = *(char *)psize_local + -0x57;
    }
    local_39 = cVar2 * '\x10';
    if ((*(char *)(psize_local + 1) < 'a') || ('z' < *(char *)(psize_local + 1))) {
      if ((*(char *)(psize_local + 1) < 'A') || ('Z' < *(char *)(psize_local + 1))) {
        if ((*(char *)(psize_local + 1) < '0') || ('9' < *(char *)(psize_local + 1))) {
          return 0xffffffffffffffff;
        }
        bVar1 = *(char *)(psize_local + 1) - 0x30;
      }
      else {
        bVar1 = *(char *)(psize_local + 1) - 0x37;
      }
    }
    else {
      bVar1 = *(char *)(psize_local + 1) + 0xa9;
    }
    local_39 = local_39 | bVar1;
    *(byte *)bsize_local = local_39;
    p_local = p_local + -1;
    psize_local = psize_local + 2;
    fbsize = fbsize - 2;
    bsize_local = bsize_local + 1;
  } while( true );
}

Assistant:

static size_t
atohex(unsigned char *b, size_t bsize, const char *p, size_t psize)
{
	size_t fbsize = bsize;

	while (bsize && psize > 1) {
		unsigned char x;

		if (p[0] >= 'a' && p[0] <= 'z')
			x = (p[0] - 'a' + 0x0a) << 4;
		else if (p[0] >= 'A' && p[0] <= 'Z')
			x = (p[0] - 'A' + 0x0a) << 4;
		else if (p[0] >= '0' && p[0] <= '9')
			x = (p[0] - '0') << 4;
		else
			return (-1);
		if (p[1] >= 'a' && p[1] <= 'z')
			x |= p[1] - 'a' + 0x0a;
		else if (p[1] >= 'A' && p[1] <= 'Z')
			x |= p[1] - 'A' + 0x0a;
		else if (p[1] >= '0' && p[1] <= '9')
			x |= p[1] - '0';
		else
			return (-1);

		*b++ = x;
		bsize--;
		p += 2;
		psize -= 2;
	}
	return (fbsize - bsize);
}